

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

int __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::ClassId
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_51;
  string local_50;
  TPZGeoLinear local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"TPZMultiphysicsCompEl",&local_51);
  uVar1 = Hash(&local_50);
  iVar2 = TPZCompEl::ClassId((TPZCompEl *)this);
  local_30.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0]._0_4_ = 0xffffffff;
  local_30.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0]._4_4_ = 0xffffffff;
  local_30.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1]._0_4_ = 0xffffffff;
  local_30.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1]._4_4_ = 0xffffffff;
  local_30.super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable._vptr_TPZSavable
       = (TPZSavable)&PTR__TPZGeoLinear_016c2718;
  iVar3 = pzgeom::TPZGeoLinear::ClassId(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZMultiphysicsCompEl<TGeometry>::ClassId() const{
    return Hash("TPZMultiphysicsCompEl") ^ TPZMultiphysicsElement::ClassId() << 1 ^ TGeometry().ClassId() << 2;
}